

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.hpp
# Opt level: O0

optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> __thiscall
duckdb::Catalog::GetEntry<duckdb::ScalarFunctionCatalogEntry>
          (Catalog *this,ClientContext *context,string *schema_name,string *name,
          OnEntryNotFound if_not_found,QueryErrorContext error_context)

{
  bool bVar1;
  CatalogEntry *pCVar2;
  undefined8 uVar3;
  ScalarFunctionCatalogEntry *ptr_p;
  string *in_RCX;
  EntryLookupInfo *in_RDX;
  optional_idx in_RSI;
  ClientContext *in_RDI;
  undefined1 in_R8B;
  QueryErrorContext in_R9;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  EntryLookupInfo lookup_info;
  CatalogEntry *in_stack_ffffffffffffff20;
  allocator *paVar4;
  string local_c8 [55];
  allocator local_91;
  string local_90 [40];
  undefined8 local_68 [2];
  EntryLookupInfo local_58 [24];
  char *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true> local_8;
  
  duckdb::EntryLookupInfo::EntryLookupInfo(local_58,SCALAR_FUNCTION_ENTRY,in_RCX,in_R9);
  local_68[0] = duckdb::Catalog::GetEntry
                          (in_RDI,(string *)in_RSI.index,in_RDX,(OnEntryNotFound)local_58);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)local_68);
  if (bVar1) {
    pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_ffffffffffffff20);
    if (pCVar2[0x10] != (CatalogEntry)0x1a) {
      uVar3 = __cxa_allocate_exception(0x10);
      paVar4 = &local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"%s is not an %s",paVar4);
      std::__cxx11::string::string(local_c8,in_RCX);
      CatalogException::CatalogException<std::__cxx11::string,char_const*>
                ((CatalogException *)in_RDX,(QueryErrorContext)in_RSI.index,(string *)in_RCX,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_R8B,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0);
      __cxa_throw(uVar3,&CatalogException::typeinfo,CatalogException::~CatalogException);
    }
    optional_ptr<duckdb::CatalogEntry,_true>::operator->
              ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_ffffffffffffff20);
    ptr_p = CatalogEntry::Cast<duckdb::ScalarFunctionCatalogEntry>(in_stack_ffffffffffffff20);
    optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true>::optional_ptr(&local_8,ptr_p);
  }
  else {
    optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true>::optional_ptr
              (&local_8,(ScalarFunctionCatalogEntry *)0x0);
  }
  return (optional_ptr<duckdb::ScalarFunctionCatalogEntry,_true>)local_8.ptr;
}

Assistant:

optional_ptr<T> GetEntry(ClientContext &context, const string &schema_name, const string &name,
	                         OnEntryNotFound if_not_found, QueryErrorContext error_context = QueryErrorContext()) {
		EntryLookupInfo lookup_info(T::Type, name, error_context);
		auto entry = GetEntry(context, schema_name, lookup_info, if_not_found);
		if (!entry) {
			return nullptr;
		}
		if (entry->type != T::Type) {
			throw CatalogException(error_context, "%s is not an %s", name, T::Name);
		}
		return &entry->template Cast<T>();
	}